

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O3

void gen_trie(fb_output_t *out,trie_t *trie,int a,int b,int pos)

{
  trie_t *ptVar1;
  int n;
  int *piVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  bool bVar4;
  uint a_00;
  int iVar5;
  long lVar6;
  long lVar7;
  char *format;
  fb_output_t *pfVar8;
  dict_entry_t *pdVar9;
  uint uVar10;
  int a_01;
  uint a_02;
  ulong uVar11;
  dict_entry_t *de;
  uint uVar12;
  int len;
  char *name;
  uint64_t wf;
  uint64_t wg;
  uint64_t wmf;
  uint64_t tag;
  uint local_a0;
  uint local_9c;
  ulong local_98;
  dict_entry_t *local_90;
  char *local_88;
  trie_t *local_80;
  uint64_t local_78;
  ulong local_70;
  uint64_t local_68;
  uint64_t local_60;
  ulong local_58;
  fb_output_t *local_50;
  uint64_t local_48;
  long local_40;
  uint64_t local_38;
  
  local_48 = 0;
  local_88 = "";
  local_a0 = 0;
  pdVar9 = trie->dict;
  lVar6 = (long)a;
  local_40 = lVar6 * 0x20;
  iVar5 = pos + 8;
  if ((pdVar9[lVar6].len < iVar5 || pdVar9[lVar6].len + -8 == pos) &&
     ((b == a || ((a + 1 == b && (pdVar9[b].len < iVar5 || pdVar9[b].len + -8 == pos)))))) {
    gen_prefix_trie(out,trie,a,b,pos,0);
    return;
  }
  uVar10 = (b - a) / 2 + a;
  local_98 = (ulong)uVar10;
  local_78 = 0;
  local_68 = 0;
  local_60 = 0;
  uVar3 = CONCAT44(in_register_00000014,a);
  uVar11 = local_98;
  local_9c = b;
  local_80 = trie;
  local_50 = out;
  if (b - a < 2) {
LAB_00113c01:
    a_01 = (int)uVar11;
    if ((int)uVar3 < a_01) {
      get_dict_tag(pdVar9 + a_01,pos,&local_48,&local_78,&local_88,(int *)&local_a0);
      pfVar8 = local_50;
      println(local_50,"if (w < 0x%lx) { /* branch \"%.*s\" */",local_48,(ulong)local_a0,local_88);
      ptVar1 = local_80;
      pfVar8->indent = pfVar8->indent + 1;
      gen_trie(pfVar8,local_80,(int)uVar3,a_01 + -1,pos);
      if (pfVar8->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x402,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
      }
      pfVar8->indent = pfVar8->indent + -1;
      println(pfVar8,"} else { /* branch \"%.*s\" */",(ulong)local_a0,local_88);
      pfVar8->indent = pfVar8->indent + 1;
      gen_trie(pfVar8,ptVar1,a_01,local_9c,pos);
      if (pfVar8->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x404,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
      }
      pfVar8->indent = pfVar8->indent + -1;
      format = "} /* branch \"%.*s\" */";
      goto LAB_00114126;
    }
    uVar10 = (uint)local_98;
    local_58 = (ulong)(int)uVar10;
    local_90 = pdVar9;
    local_70 = uVar3;
  }
  else {
    uVar11 = (ulong)(int)uVar10;
    de = pdVar9 + uVar11;
    local_90 = pdVar9;
    local_70 = CONCAT44(in_register_00000014,a);
    local_58 = uVar11;
    do {
      get_dict_tag(de + -1,pos,&local_78,&local_60,(char **)0x0,(int *)0x0);
      get_dict_tag(de,pos,&local_68,&local_38,(char **)0x0,(int *)0x0);
      uVar3 = local_70;
      pdVar9 = local_90;
      if ((local_60 & (local_68 ^ local_78)) != 0) goto LAB_00113c01;
      uVar11 = uVar11 - 1;
      de = de + -1;
    } while (lVar6 < (long)uVar11);
    uVar10 = (uint)local_98;
  }
  lVar6 = 0;
  local_78 = 0;
  local_68 = 0;
  if ((int)uVar10 < (int)local_9c) {
    uVar10 = local_9c;
  }
  local_98 = (ulong)uVar10;
  local_60 = 0;
  pdVar9 = local_90 + local_58;
  lVar7 = local_58 - (long)(int)uVar10;
  do {
    if (lVar7 == lVar6) {
      uVar10 = (int)local_98 + 1;
      goto LAB_00113daa;
    }
    get_dict_tag(pdVar9,pos,&local_78,&local_60,(char **)0x0,(int *)0x0);
    pdVar9 = pdVar9 + 1;
    get_dict_tag(pdVar9,pos,&local_68,&local_38,(char **)0x0,(int *)0x0);
    lVar6 = lVar6 + -1;
  } while ((local_60 & (local_68 ^ local_78)) == 0);
  uVar10 = (int)local_58 - (int)lVar6;
LAB_00113daa:
  pdVar9 = local_90;
  uVar3 = (ulong)uVar10;
  a_00 = (uint)local_70;
  a_02 = a_00;
  uVar12 = local_9c;
  pfVar8 = local_50;
  if ((int)a_00 < (int)uVar10) {
    piVar2 = (int *)((long)&local_90->len + local_40);
    uVar11 = local_70 & 0xffffffff;
    do {
      a_02 = (uint)uVar11;
      if ((iVar5 <= *piVar2) && (0 < (*piVar2 - pos) + -8)) goto LAB_00113e02;
      uVar11 = (ulong)(a_02 + 1);
      piVar2 = piVar2 + 8;
    } while (uVar10 != a_02 + 1);
    bVar4 = false;
    a_02 = uVar10;
  }
  else {
LAB_00113e02:
    if ((int)a_02 < (int)uVar10) {
      if ((int)a_00 < (int)a_02) {
        bVar4 = local_90[(long)(int)a_02 + -1].len - pos == 8 &&
                local_90[(long)(int)a_02 + -1].len <= iVar5;
      }
      else {
        bVar4 = false;
      }
      local_90 = (dict_entry_t *)CONCAT44(local_90._4_4_,uVar10 - 1);
      local_98 = uVar3;
      get_dict_tag(pdVar9 + (int)a_02,pos,&local_48,&local_78,&local_88,(int *)&local_a0);
      pfVar8 = local_50;
      println(local_50,"if (w == 0x%lx) { /* descend \"%.*s\" */",local_48,(ulong)local_a0,local_88)
      ;
      pfVar8->indent = pfVar8->indent + 1;
      if (bVar4) {
        println(pfVar8,"/* descend prefix key \"%.*s\" */",(ulong)local_a0,local_88);
        ptVar1 = local_80;
        (*local_80->gen_match)
                  (pfVar8,local_80->ct,local_80->dict[(long)(int)a_02 + -1].data,
                   local_80->dict[(long)(int)a_02 + -1].hint,8);
        println(pfVar8,"/* descend suffix \"%.*s\" */",(ulong)local_a0,local_88);
        println(pfVar8,"buf += 8;");
        println(pfVar8,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(pfVar8,ptVar1,a_02,(int)local_90,iVar5);
        uVar12 = local_9c;
        if (pfVar8->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x445,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
        }
        pfVar8->indent = pfVar8->indent + -1;
        println(pfVar8,"} /* desend suffix \"%.*s\" */",(ulong)local_a0,local_88);
        a_02 = a_02 - 1;
      }
      else {
        println(pfVar8,"buf += 8;");
        println(pfVar8,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(pfVar8,local_80,a_02,(int)local_90,iVar5);
        uVar12 = local_9c;
      }
      uVar3 = local_98;
      a_00 = (uint)local_70;
      if (pfVar8->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x449,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
      }
      pfVar8->indent = pfVar8->indent + -1;
      println(pfVar8,"} else { /* descend \"%.*s\" */",(ulong)local_a0,local_88);
      pfVar8->indent = pfVar8->indent + 1;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  ptVar1 = local_80;
  iVar5 = (int)uVar3;
  if (((int)uVar12 < iVar5) || ((int)a_02 <= (int)a_00)) {
    if ((int)a_00 < (int)a_02) {
      gen_prefix_trie(pfVar8,local_80,a_00,a_02 - 1,pos,0);
      if (iVar5 <= (int)uVar12) {
        gen_trie(pfVar8,ptVar1,iVar5,uVar12,pos);
      }
    }
    else if ((int)uVar12 < iVar5) {
      (*local_80->gen_unmatched)(pfVar8);
    }
    else {
      gen_trie(pfVar8,local_80,iVar5,uVar12,pos);
    }
  }
  else {
    uVar10 = local_80->label + 1;
    local_80->label = uVar10;
    local_98 = uVar3;
    gen_prefix_trie(pfVar8,local_80,a_00,a_02 - 1,pos,uVar10);
    println(pfVar8,"goto endpfguard%d;",(ulong)uVar10);
    pfVar8->tmp_indent = pfVar8->indent;
    pfVar8->indent = 0;
    println(pfVar8,"pfguard%d:",(ulong)uVar10);
    pfVar8->indent = pfVar8->tmp_indent;
    gen_trie(pfVar8,ptVar1,(int)local_98,uVar12,pos);
    pfVar8->tmp_indent = pfVar8->indent;
    pfVar8->indent = 0;
    println(pfVar8,"endpfguard%d:",(ulong)uVar10);
    pfVar8->indent = pfVar8->tmp_indent;
    println(pfVar8,"(void)0;");
  }
  if (!bVar4) {
    return;
  }
  if (pfVar8->indent == 0) {
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x465,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
  }
  pfVar8->indent = pfVar8->indent + -1;
  format = "} /* descend \"%.*s\" */";
LAB_00114126:
  println(pfVar8,format,(ulong)local_a0,local_88);
  return;
}

Assistant:

static void gen_trie(fb_output_t *out, trie_t *trie, int a, int b, int pos)
{
    int x, k;
    uint64_t tag = 0, mask = 0;
    const char *name = "";
    int len = 0, has_prefix_key = 0, prefix_guard = 0, has_descend;
    int label = 0;

    /*
     * Process a trie at the level given by pos. A single level covers
     * one tag.
     *
     * A tag is a range of 8 characters [pos..pos+7] that is read as a
     * single big endian word and tested as against a ternary trie
     * generated in code. In generated code the tag is stored in "w".
     *
     * Normally trailing data in a tag is not a problem
     * because the difference between two keys happen in the middle and
     * trailing data is not valid key material. When the difference is
     * at the end, we get a lot of special cases to handle.
     *
     * Regardless, when we believe we have a match, a final check is
     * made to ensure that the next character after the match is not a
     * valid key character - for quoted keys a valid termiantot is a
     * quote, for unquoted keys it can be one of several characters -
     * therefore quoted keys are faster to parse, even if they consume
     * more space. The trie does not care about these details, the
     * gen_match function handles this transparently for different
     * symbol types.
     */


    /*
    * If we have one or two keys that terminate in this tag, there is no
    * need to do a branch test before matching exactly.
    *
    * We observe that `gen_prefix_trie` actually handles this
    * case well, even though it was not designed for it.
    */
    if ((get_dict_suffix_len(&trie->dict[a], pos) == 0) &&
        (b == a || (b == a + 1 && get_dict_suffix_len(&trie->dict[b], pos) == 0))) {
        gen_prefix_trie(out, trie, a, b, pos, 0);
        return;
    }

    /*
     * Due trie nature, we have a left, middle, and right range where
     * the middle range all compare the same at the current trie level
     * when masked against shortest (and first) key in middle range.
     */
    x = split_dict_left(trie->dict, a, b, pos);

    if (x > a) {
        /*
         * This is normal early branch with a key `a < x < b` such that
         * any shared prefix ranges do not span x.
         */
        get_dict_tag(&trie->dict[x], pos, &tag, &mask, &name, &len);
        println(out, "if (w < 0x%"PRIx64") { /* branch \"%.*s\" */", tag, len, name); indent();
        gen_trie(out, trie, a, x - 1, pos);
        unindent(); println(out, "} else { /* branch \"%.*s\" */", len, name); indent();
        gen_trie(out, trie, x, b, pos);
        unindent(); println(out, "} /* branch \"%.*s\" */", len, name);
        return;
    }
    x = split_dict_right(trie->dict, a, b, pos);

    /*
     * [a .. x-1] is a non-empty sequence of prefixes,
     * for example { a123, a1234, a12345 }.
     * The keys might not terminate in the current tag. To find those
     * that do, we will evaluate k such that:
     * [a .. k-1] are prefixes that terminate in the current tag if any
     * such exists.
     * [x..b] are keys that are prefixes up to at least pos + 7 but
     * do not terminate in the current tag.
     * [k..x-1] are prefixes that do not termiante in the current tag.
     * Note that they might not be prefixes when considering more than the
     * current tag.
     * The range [a .. x-1] can ge generated with `gen_prefix_trie`.
     *
     * We generally have the form
     *
     * [a..b] =
     * (a)<prefixes>, (k-1)<descend-prefix>, (k)<descend>, (x)<reminder>
     *
     * Where <prefixes> are keys that terminate at the current tag.
     * <descend> are keys that have the prefixes as prefix but do not
     * terminate at the current tag.
     * <descend-prerfix> is a single key that terminates exactly
     * where the tag ends. If there are no descend keys it is part of
     * prefixes, otherwise it is tested as a special case.
     * <reminder> are any keys larger than the prefixes.
     *
     * The reminder keys cannot be tested before we are sure that no
     * prefix is matching at least no prefixes that is not a
     * descend-prefix. This is because less than comparisons are
     * affected by trailing data within the tag caused by prefixes
     * terminating early. Trailing data is not a problem if two keys are
     * longer than the point where they differ even if they terminate
     * within the current tag.
     *
     * Thus, if we have non-empty <descend> and non-empty <reminder>,
     * the reminder must guard against any matches in prefix but not
     * against any matches in <descend>. If <descend> is empty and
     * <prefixes> == <descend-prefix> a guard is also not needed.
     */

    /* Find first prefix that does not terminate at the current level, or x if absent */
    k = split_dict_descend(trie->dict, a, x - 1, pos);
    has_descend = k < x;

    /* If we have a descend, process that in isolation. */
    if (has_descend) {
        has_prefix_key = k > a && get_dict_tag_len(&trie->dict[k - 1], pos) == 8;
        get_dict_tag(&trie->dict[k], pos, &tag, &mask, &name, &len);
        println(out, "if (w == 0x%"PRIx64") { /* descend \"%.*s\" */", tag, len, name); indent();
        if (has_prefix_key) {
            /* We have a key that terminates at the descend prefix. */
            println(out, "/* descend prefix key \"%.*s\" */", len, name);
            trie->gen_match(out, trie->ct, trie->dict[k - 1].data, trie->dict[k - 1].hint, 8);
            println(out, "/* descend suffix \"%.*s\" */", len, name);
        }
        println(out, "buf += 8;");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, trie, k, x - 1, pos + 8);
        if (has_prefix_key) {
            unindent(); println(out, "} /* desend suffix \"%.*s\" */", len, name);
            /* Here we move the <descend-prefix> key out of the <descend> range. */
            --k;
        }
        unindent(); println(out, "} else { /* descend \"%.*s\" */", len, name); indent();
    }
    prefix_guard = a < k && x <= b;
    if (prefix_guard) {
        label = ++trie->label;
    }
    if (a < k) {
        gen_prefix_trie(out, trie, a, k - 1, pos, label);
    }
    if (prefix_guard) {
        /* All prefixes tested, but none matched. */
        println(out, "goto endpfguard%d;", label);
        margin();
        println(out, "pfguard%d:", label);
        unmargin();
    }
    if (x <= b) {
        gen_trie(out, trie, x, b, pos);
    } else if (a >= k) {
        trie->gen_unmatched(out);
    }
    if (prefix_guard) {
        margin();
        println(out, "endpfguard%d:", label);
        unmargin();
        println(out, "(void)0;");
    }
    if (has_descend) {
        unindent(); println(out, "} /* descend \"%.*s\" */", len, name);
    }
}